

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralizedMAAStarPlanner.cpp
# Opt level: O0

void __thiscall GeneralizedMAAStarPlanner::Plan(GeneralizedMAAStarPlanner *this)

{
  ulong uVar1;
  int iVar2;
  type pPVar3;
  type pPVar4;
  undefined8 uVar5;
  long lVar6;
  ostream *poVar7;
  undefined8 uVar8;
  undefined4 extraout_var;
  type pPVar9;
  size_type sVar10;
  undefined4 extraout_var_00;
  reference pvVar11;
  undefined4 extraout_var_01;
  type pPVar12;
  type pPVar13;
  void *this_00;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  size_t sVar14;
  type pJVar15;
  long *in_RDI;
  double dVar16;
  double extraout_XMM0_Qa;
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar17 [16];
  undefined8 extraout_XMM1_Qb_00;
  undefined8 extraout_XMM1_Qb_01;
  undefined8 extraout_XMM1_Qb_02;
  undefined8 extraout_XMM1_Qb_03;
  JPPV_sharedPtr jppv;
  clock_t diff;
  clock_t tck_cur;
  tms ts_cur;
  double bestNextVal;
  PartialPolicyPoolItemInterface_sharedPtr bestRanked_ppi;
  bool are_LBs;
  bool cleanUpPPI;
  PartialPolicyPoolInterface_sharedPtr poolOfNextPolicies;
  size_t depth_sel;
  double v_sel;
  shared_ptr<PartialJointPolicyDiscretePure> jpol_sel;
  PartialPolicyPoolItemInterface_sharedPtr ppi;
  EDeadline e;
  stringstream ss;
  double timeSpentInS;
  clock_t utime;
  PartialPolicyPoolInterface_sharedPtr pp_p;
  shared_ptr<PartialJointPolicyDiscretePure> bestJPol;
  tms ts_after;
  tms ts_before;
  ofstream *its;
  clock_t tck_start;
  tms ts_start;
  EDeadline *in_stack_fffffffffffff798;
  EDeadline *in_stack_fffffffffffff7a0;
  shared_ptr<PartialJointPolicyDiscretePure> *in_stack_fffffffffffff7b8;
  shared_ptr<JointPolicyDiscretePure> *in_stack_fffffffffffff7c0;
  size_type in_stack_fffffffffffff7c8;
  allocator<char> *in_stack_fffffffffffff7d0;
  string *in_stack_fffffffffffff7d8;
  EDeadline *in_stack_fffffffffffff7e0;
  GeneralizedMAAStarPlanner *in_stack_fffffffffffff800;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff988;
  string local_550 [32];
  string local_530 [39];
  allocator<char> local_509;
  string local_508 [32];
  shared_ptr<JointPolicyPureVector> local_4e8;
  string local_4d8 [32];
  string local_4b8 [32];
  string local_498 [32];
  string local_478 [39];
  allocator<char> local_451;
  string local_450 [32];
  undefined1 local_430 [16];
  long local_420;
  clock_t local_418;
  tms local_410;
  string local_3f0 [32];
  shared_ptr<PartialJointPolicyDiscretePure> local_3d0;
  string local_3c0 [32];
  shared_ptr<PartialJointPolicyDiscretePure> local_3a0;
  double local_390;
  shared_ptr<PartialPolicyPoolItemInterface> local_388;
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_358;
  byte local_33a;
  byte local_339;
  shared_ptr<PartialPolicyPoolInterface> local_338;
  int local_324;
  shared_ptr<PartialJointPolicyDiscretePure> local_320;
  ulong local_310;
  double local_308;
  shared_ptr<PartialJointPolicyDiscretePure> local_300;
  shared_ptr<PartialPolicyPoolItemInterface> local_2f0;
  allocator<char> local_2d9;
  string local_2d8 [32];
  string local_2b8 [80];
  stringstream local_268 [16];
  ostream local_258 [376];
  double local_e0;
  long local_d8;
  shared_ptr<PartialPolicyPoolInterface> local_d0;
  shared_ptr<PartialJointPolicyDiscretePure> local_c0;
  tms local_b0;
  tms local_90;
  void *local_70;
  clock_t local_68;
  tms local_60;
  allocator<char> local_29;
  string local_28 [40];
  
  Initialize(in_stack_fffffffffffff800);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7e0,(char *)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0);
  TimedAlgorithm::StartTimer
            ((TimedAlgorithm *)in_stack_fffffffffffff7a0,(string *)in_stack_fffffffffffff798);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  local_68 = times(&local_60);
  local_70 = (void *)in_RDI[9];
  times(&local_90);
  (**(code **)(*in_RDI + 0x38))();
  pPVar3 = boost::shared_ptr<PartialJointPolicyDiscretePure>::operator->(&local_c0);
  PartialJointPolicy::SetPastReward(&pPVar3->super_PartialJointPolicy,-1.79769313486232e+308);
  (**(code **)(*in_RDI + 0x28))(&local_d0);
  pPVar4 = boost::shared_ptr<PartialPolicyPoolInterface>::operator->(&local_d0);
  uVar5 = (**(code **)(*in_RDI + 0x10))();
  uVar8 = extraout_XMM1_Qb;
  (*pPVar4->_vptr_PartialPolicyPoolInterface[3])(pPVar4,uVar5);
  do {
    if (in_RDI[2] != 0) {
      times(&local_b0);
      local_d8 = local_b0.tms_utime - local_90.tms_utime;
      dVar16 = (double)local_d8;
      lVar6 = sysconf(2);
      auVar17._0_8_ = (double)lVar6;
      auVar17._8_8_ = uVar8;
      local_e0 = dVar16 / auVar17._0_8_;
      auVar17 = vcvtusi2sd_avx512f(auVar17,in_RDI[2]);
      if (auVar17._0_8_ < local_e0) {
        std::__cxx11::stringstream::stringstream(local_268);
        poVar7 = std::operator<<(local_258,"GeneralizedMAAStarPlanner::Plan() we spent ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_e0);
        poVar7 = std::operator<<(poVar7,"s, which is more than the deadline of ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,in_RDI[2]);
        std::operator<<(poVar7,"s, bailing out...");
        std::__cxx11::stringstream::str();
        EDeadline::EDeadline
                  (in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8,
                   (double)in_stack_fffffffffffff7d0);
        std::__cxx11::string::~string(local_2b8);
        uVar8 = __cxa_allocate_exception(0x30);
        EDeadline::EDeadline(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
        __cxa_throw(uVar8,&EDeadline::typeinfo,EDeadline::~EDeadline);
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff7e0,(char *)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0
              );
    TimedAlgorithm::StartTimer
              ((TimedAlgorithm *)in_stack_fffffffffffff7a0,(string *)in_stack_fffffffffffff798);
    std::__cxx11::string::~string(local_2d8);
    dVar16 = (double)std::allocator<char>::~allocator(&local_2d9);
    if ((*(byte *)((long)in_RDI + 0x51) & 1) != 0) {
      TimedAlgorithm::SaveTimers
                ((TimedAlgorithm *)in_stack_fffffffffffff7a0,(string *)in_stack_fffffffffffff798);
    }
    if (1 < (int)in_RDI[8]) {
      std::operator<<((ostream *)&std::cout,
                      "\n---------------------------------------------------\n");
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "-->>Start of new GMAA iteration, polpool size=");
      pPVar4 = boost::shared_ptr<PartialPolicyPoolInterface>::operator->(&local_d0);
      iVar2 = (*pPVar4->_vptr_PartialPolicyPoolInterface[0xb])();
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,CONCAT44(extraout_var,iVar2));
      poVar7 = std::operator<<(poVar7,"<<--");
      dVar16 = (double)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    pPVar4 = boost::shared_ptr<PartialPolicyPoolInterface>::operator->(&local_d0);
    (*pPVar4->_vptr_PartialPolicyPoolInterface[4])(&local_2f0);
    pPVar9 = boost::shared_ptr<PartialPolicyPoolItemInterface>::operator->(&local_2f0);
    (*pPVar9->_vptr_PartialPolicyPoolItemInterface[2])(&local_300);
    pPVar9 = boost::shared_ptr<PartialPolicyPoolItemInterface>::operator->(&local_2f0);
    (*pPVar9->_vptr_PartialPolicyPoolItemInterface[3])();
    local_308 = dVar16;
    pPVar3 = boost::shared_ptr<PartialJointPolicyDiscretePure>::operator->(&local_300);
    local_310 = JointPolicy::GetDepth((JointPolicy *)pPVar3);
    if (2 < (int)in_RDI[8]) {
      poVar7 = std::operator<<((ostream *)&std::cout,"GMAA Selected a partial jpol of depth=");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_310);
      poVar7 = std::operator<<(poVar7," and heur. val=");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_308);
      poVar7 = std::operator<<(poVar7," to expand");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      if (3 < (int)in_RDI[8]) {
        pPVar9 = boost::shared_ptr<PartialPolicyPoolItemInterface>::operator->(&local_2f0);
        (*pPVar9->_vptr_PartialPolicyPoolItemInterface[2])(&local_320);
        pPVar3 = boost::shared_ptr<PartialJointPolicyDiscretePure>::operator->(&local_320);
        (*(pPVar3->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
          _vptr_JointPolicy[7])();
        boost::shared_ptr<PartialJointPolicyDiscretePure>::~shared_ptr
                  ((shared_ptr<PartialJointPolicyDiscretePure> *)0x960919);
      }
    }
    uVar8 = 0;
    if ((double)in_RDI[6] <= local_308 + (double)in_RDI[0x16]) {
      (**(code **)(*in_RDI + 0x28))(&local_338);
      local_339 = 1;
      local_33a = (**(code **)(*in_RDI + 0x18))(in_RDI,&local_2f0,&local_338,&local_339);
      local_33a = local_33a & 1;
      dVar16 = extraout_XMM0_Qa;
      sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x17));
      if (sVar10 <= local_310) {
        local_358.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,
                   (value_type_conflict2 *)in_stack_fffffffffffff7c0);
      }
      pPVar4 = boost::shared_ptr<PartialPolicyPoolInterface>::operator->(&local_338);
      iVar2 = (*pPVar4->_vptr_PartialPolicyPoolInterface[0xb])();
      pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_fffffffffffff7a0,(size_type)in_stack_fffffffffffff798);
      *pvVar11 = CONCAT44(extraout_var_00,iVar2) + *pvVar11;
      if ((local_339 & 1) == 0) {
        pPVar4 = boost::shared_ptr<PartialPolicyPoolInterface>::operator->(&local_d0);
        boost::shared_ptr<PartialPolicyPoolItemInterface>::shared_ptr
                  ((shared_ptr<PartialPolicyPoolItemInterface> *)in_stack_fffffffffffff7a0,
                   (shared_ptr<PartialPolicyPoolItemInterface> *)in_stack_fffffffffffff798);
        (*pPVar4->_vptr_PartialPolicyPoolInterface[5])(pPVar4,local_368);
        boost::shared_ptr<PartialPolicyPoolItemInterface>::~shared_ptr
                  ((shared_ptr<PartialPolicyPoolItemInterface> *)0x960c00);
        pPVar4 = boost::shared_ptr<PartialPolicyPoolInterface>::operator->(&local_d0);
        boost::shared_ptr<PartialPolicyPoolItemInterface>::shared_ptr
                  ((shared_ptr<PartialPolicyPoolItemInterface> *)in_stack_fffffffffffff7a0,
                   (shared_ptr<PartialPolicyPoolItemInterface> *)in_stack_fffffffffffff798);
        (*pPVar4->_vptr_PartialPolicyPoolInterface[8])(pPVar4,local_378);
        boost::shared_ptr<PartialPolicyPoolItemInterface>::~shared_ptr
                  ((shared_ptr<PartialPolicyPoolItemInterface> *)0x960c5c);
      }
      else {
        pPVar4 = boost::shared_ptr<PartialPolicyPoolInterface>::operator->(&local_d0);
        in_stack_fffffffffffff988 = &local_358;
        boost::shared_ptr<PartialPolicyPoolItemInterface>::shared_ptr
                  ((shared_ptr<PartialPolicyPoolItemInterface> *)in_stack_fffffffffffff7a0,
                   (shared_ptr<PartialPolicyPoolItemInterface> *)in_stack_fffffffffffff798);
        (*pPVar4->_vptr_PartialPolicyPoolInterface[5])(pPVar4,in_stack_fffffffffffff988);
        boost::shared_ptr<PartialPolicyPoolItemInterface>::~shared_ptr
                  ((shared_ptr<PartialPolicyPoolItemInterface> *)0x960b79);
      }
      if ((local_33a & 1) != 0) {
        pPVar4 = boost::shared_ptr<PartialPolicyPoolInterface>::operator->(&local_338);
        iVar2 = (*pPVar4->_vptr_PartialPolicyPoolInterface[0xb])();
        if (CONCAT44(extraout_var_01,iVar2) != 0) {
          pPVar4 = boost::shared_ptr<PartialPolicyPoolInterface>::operator->(&local_338);
          (*pPVar4->_vptr_PartialPolicyPoolInterface[6])(&local_388);
          pPVar4 = boost::shared_ptr<PartialPolicyPoolInterface>::operator->(&local_338);
          (*pPVar4->_vptr_PartialPolicyPoolInterface[7])();
          pPVar9 = boost::shared_ptr<PartialPolicyPoolItemInterface>::operator->(&local_388);
          (*pPVar9->_vptr_PartialPolicyPoolItemInterface[3])();
          local_390 = dVar16;
          if ((double)in_RDI[6] < dVar16) {
            in_RDI[6] = (long)dVar16;
            pPVar9 = boost::shared_ptr<PartialPolicyPoolItemInterface>::operator->(&local_388);
            (*pPVar9->_vptr_PartialPolicyPoolItemInterface[2])(&local_3a0);
            pPVar12 = boost::shared_ptr<PartialJointPolicyDiscretePure>::operator*(&local_3a0);
            pPVar13 = boost::shared_ptr<PartialJointPolicyDiscretePure>::operator*(&local_c0);
            (*(pPVar13->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
              _vptr_JointPolicy[0x16])(pPVar13,pPVar12);
            boost::shared_ptr<PartialJointPolicyDiscretePure>::~shared_ptr
                      ((shared_ptr<PartialJointPolicyDiscretePure> *)0x960e5a);
            if (1 < (int)in_RDI[8]) {
              std::operator<<((ostream *)&std::cout,"new bestJPol (and max. lowerbound) found! - ");
              poVar7 = std::operator<<((ostream *)&std::cout,"value v=");
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_390);
              poVar7 = std::operator<<(poVar7," - ");
              pPVar9 = boost::shared_ptr<PartialPolicyPoolItemInterface>::operator->(&local_388);
              (*pPVar9->_vptr_PartialPolicyPoolItemInterface[2])(&local_3d0);
              pPVar3 = boost::shared_ptr<PartialJointPolicyDiscretePure>::operator->(&local_3d0);
              (*(pPVar3->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
                _vptr_JointPolicy[0x15])(local_3c0);
              poVar7 = std::operator<<(poVar7,local_3c0);
              std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              std::__cxx11::string::~string(local_3c0);
              boost::shared_ptr<PartialJointPolicyDiscretePure>::~shared_ptr
                        ((shared_ptr<PartialJointPolicyDiscretePure> *)0x960f92);
            }
            if (3 < (int)in_RDI[8]) {
              poVar7 = std::operator<<((ostream *)&std::cout,"new bestJPol->SoftPrint():");
              pPVar3 = boost::shared_ptr<PartialJointPolicyDiscretePure>::operator->(&local_c0);
              (*(pPVar3->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
                _vptr_JointPolicy[6])(local_3f0);
              std::operator<<(poVar7,local_3f0);
              std::__cxx11::string::~string(local_3f0);
            }
            if (in_RDI[9] != 0) {
              local_418 = times(&local_410);
              local_420 = local_418 - local_68;
              poVar7 = (ostream *)std::ostream::operator<<(local_70,local_420);
              poVar7 = std::operator<<(poVar7,"\t");
              this_00 = (void *)std::ostream::operator<<(poVar7,(double)in_RDI[6]);
              std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
            }
            pPVar4 = boost::shared_ptr<PartialPolicyPoolInterface>::operator->(&local_d0);
            (*pPVar4->_vptr_PartialPolicyPoolInterface[10])
                      ((double)in_RDI[6] - (double)in_RDI[0x16]);
          }
          boost::shared_ptr<PartialPolicyPoolItemInterface>::~shared_ptr
                    ((shared_ptr<PartialPolicyPoolItemInterface> *)0x9611da);
        }
      }
      (**(code **)(*in_RDI + 0x20))
                ((double)in_RDI[6] - (double)in_RDI[0x16],in_RDI,&local_338,local_33a & 1);
      pPVar4 = boost::shared_ptr<PartialPolicyPoolInterface>::operator->(&local_d0);
      boost::shared_ptr<PartialPolicyPoolInterface>::shared_ptr
                ((shared_ptr<PartialPolicyPoolInterface> *)in_stack_fffffffffffff7a0,
                 (shared_ptr<PartialPolicyPoolInterface> *)in_stack_fffffffffffff798);
      (*pPVar4->_vptr_PartialPolicyPoolInterface[9])(pPVar4,local_430);
      boost::shared_ptr<PartialPolicyPoolInterface>::~shared_ptr
                ((shared_ptr<PartialPolicyPoolInterface> *)0x961281);
      uVar1 = in_RDI[7];
      pPVar4 = boost::shared_ptr<PartialPolicyPoolInterface>::operator->(&local_d0);
      iVar2 = (*pPVar4->_vptr_PartialPolicyPoolInterface[0xb])();
      if (uVar1 < CONCAT44(extraout_var_02,iVar2)) {
        pPVar4 = boost::shared_ptr<PartialPolicyPoolInterface>::operator->(&local_d0);
        iVar2 = (*pPVar4->_vptr_PartialPolicyPoolInterface[0xb])();
        in_RDI[7] = CONCAT44(extraout_var_03,iVar2);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff7e0,(char *)in_stack_fffffffffffff7d8,
                 in_stack_fffffffffffff7d0);
      TimedAlgorithm::StopTimer
                ((TimedAlgorithm *)in_stack_fffffffffffff7a0,(string *)in_stack_fffffffffffff798);
      std::__cxx11::string::~string(local_450);
      std::allocator<char>::~allocator(&local_451);
      uVar8 = extraout_XMM1_Qb_00;
      if (1 < (int)in_RDI[8]) {
        if (((double)in_RDI[6] != -1.79769313486232e+308) || (NAN((double)in_RDI[6]))) {
          poVar7 = std::operator<<((ostream *)&std::cout,
                                   "--GMAA::Plan::iteration ending, polpool size=");
          pPVar4 = boost::shared_ptr<PartialPolicyPoolInterface>::operator->(&local_d0);
          iVar2 = (*pPVar4->_vptr_PartialPolicyPoolInterface[0xb])();
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,CONCAT44(extraout_var_05,iVar2));
          std::operator<<(poVar7,", best policy found so far:");
          poVar7 = (ostream *)
                   std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
          pPVar3 = boost::shared_ptr<PartialJointPolicyDiscretePure>::operator->(&local_c0);
          (*(pPVar3->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
            _vptr_JointPolicy[0x15])(local_478);
          poVar7 = std::operator<<(poVar7,local_478);
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string(local_478);
          uVar8 = extraout_XMM1_Qb_02;
          if (4 < (int)in_RDI[8]) {
            poVar7 = (ostream *)
                     std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
            pPVar3 = boost::shared_ptr<PartialJointPolicyDiscretePure>::operator->(&local_c0);
            (*(pPVar3->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
              _vptr_JointPolicy[6])(local_498);
            poVar7 = std::operator<<(poVar7,local_498);
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string(local_498);
            uVar8 = extraout_XMM1_Qb_03;
          }
        }
        else {
          poVar7 = std::operator<<((ostream *)&std::cout,
                                   "--GMAA::Plan::iteration ending, polpool size=");
          pPVar4 = boost::shared_ptr<PartialPolicyPoolInterface>::operator->(&local_d0);
          iVar2 = (*pPVar4->_vptr_PartialPolicyPoolInterface[0xb])();
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,CONCAT44(extraout_var_04,iVar2));
          uVar8 = extraout_XMM1_Qb_01;
          std::operator<<(poVar7,", no complete policy found yet");
        }
      }
      boost::shared_ptr<PartialPolicyPoolInterface>::~shared_ptr
                ((shared_ptr<PartialPolicyPoolInterface> *)0x9616cb);
      local_324 = 0;
    }
    else {
      if (-1 < (int)in_RDI[8]) {
        std::operator<<((ostream *)&std::cout,
                        "!!!GMAA::Plan highest upper < best found lower bound, stopping\n");
      }
      local_324 = 2;
    }
    boost::shared_ptr<PartialJointPolicyDiscretePure>::~shared_ptr
              ((shared_ptr<PartialJointPolicyDiscretePure> *)0x9616e3);
    boost::shared_ptr<PartialPolicyPoolItemInterface>::~shared_ptr
              ((shared_ptr<PartialPolicyPoolItemInterface> *)0x9616f0);
    if (local_324 != 0) break;
    boost::shared_ptr<PartialPolicyPoolInterface>::operator->(&local_d0);
    sVar14 = PartialPolicyPoolInterface::Empty((PartialPolicyPoolInterface *)0x96171f);
  } while (sVar14 == 0);
  boost::shared_ptr<JointPolicyDiscretePure>::operator=
            (in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8);
  in_RDI[5] = in_RDI[6];
  if (0 < (int)in_RDI[8]) {
    std::operator<<((ostream *)&std::cout,"\n----GMAA::Plan ending, best policy found:----\n");
    pPVar3 = boost::shared_ptr<PartialJointPolicyDiscretePure>::operator->(&local_c0);
    (*(pPVar3->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
      _vptr_JointPolicy[0x15])(local_4b8);
    poVar7 = std::operator<<((ostream *)&std::cout,local_4b8);
    poVar7 = std::operator<<(poVar7," = ");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_4b8);
    if (2 < (int)in_RDI[8]) {
      in_stack_fffffffffffff7e0 =
           (EDeadline *)
           boost::shared_ptr<JointPolicyDiscretePure>::operator->
                     ((shared_ptr<JointPolicyDiscretePure> *)(in_RDI + 3));
      (*(((JointPolicyDiscrete *)&in_stack_fffffffffffff7e0->super_E)->super_JointPolicy).
        _vptr_JointPolicy[6])(local_4d8);
      in_stack_fffffffffffff7d8 = (string *)std::operator<<((ostream *)&std::cout,local_4d8);
      std::ostream::operator<<(in_stack_fffffffffffff7d8,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_4d8);
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    if (1 < (int)in_RDI[8]) {
      in_stack_fffffffffffff7d0 =
           (allocator<char> *)
           boost::shared_ptr<JointPolicyDiscretePure>::operator->
                     ((shared_ptr<JointPolicyDiscretePure> *)(in_RDI + 3));
      (**(code **)(*(long *)in_stack_fffffffffffff7d0 + 0xa0))(&local_4e8);
      pJVar15 = boost::shared_ptr<JointPolicyPureVector>::operator->(&local_4e8);
      (*(pJVar15->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
        _vptr_JointPolicy[7])();
      boost::shared_ptr<JointPolicyPureVector>::~shared_ptr
                ((shared_ptr<JointPolicyPureVector> *)0x96198a);
    }
  }
  if (1 < (int)in_RDI[8]) {
    std::operator<<((ostream *)&std::cout,"\n\n ");
  }
  if (-1 < (int)in_RDI[8]) {
    poVar7 = std::operator<<((ostream *)&std::cout,"GMAA::Plan GMAA ENDED");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  }
  if (1 < (int)in_RDI[8]) {
    std::operator<<((ostream *)&std::cout,"\n\n ");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7e0,(char *)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0);
  TimedAlgorithm::StopTimer
            ((TimedAlgorithm *)in_stack_fffffffffffff7a0,(string *)in_stack_fffffffffffff798);
  std::__cxx11::string::~string(local_508);
  std::allocator<char>::~allocator(&local_509);
  if (-1 < (int)in_RDI[8]) {
    poVar7 = std::operator<<((ostream *)&std::cout,"Expanded nodes at different stages:\n");
    PrintTools::SoftPrintVector<unsigned_long>(in_stack_fffffffffffff988);
    poVar7 = std::operator<<(poVar7,local_530);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_530);
    poVar7 = std::operator<<((ostream *)&std::cout,
                             "Maximum number of nodes that could have been expanded:\n");
    PrintTools::SoftPrintVector<unsigned_long_long>
              ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
               in_stack_fffffffffffff988);
    poVar7 = std::operator<<(poVar7,local_550);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_550);
  }
  boost::shared_ptr<PartialPolicyPoolInterface>::~shared_ptr
            ((shared_ptr<PartialPolicyPoolInterface> *)0x961c29);
  boost::shared_ptr<PartialJointPolicyDiscretePure>::~shared_ptr
            ((shared_ptr<PartialJointPolicyDiscretePure> *)0x961c36);
  return;
}

Assistant:

void GeneralizedMAAStarPlanner::Plan()    
{
    Initialize();

    StartTimer("GMAA::Plan");

    //stuff for timing (if used)
    tms ts_start;   //the time struct
    clock_t tck_start;  //ticks
    tck_start = times(&ts_start);
    //the intermediate timing stream
    ofstream & its = *_m_intermediateResultFile;

    tms ts_before, ts_after;
    times(&ts_before);

    boost::shared_ptr<PartialJointPolicyDiscretePure> bestJPol = NewJPol();

    bestJPol->SetPastReward(-DBL_MAX);
#if DEBUG_GMAA_POLS    
    cout << "GMAA initialized with empty policy:"<<endl;
    bestJPol->Print();
#endif

    // Setup the Policy Pool
    PartialPolicyPoolInterface_sharedPtr pp_p = NewPP(); 
    pp_p->Init( GetThisFromMostDerivedPU() ); //initialize with empty joint policy

    do
    {
        if(_m_deadline)
        {
            times(&ts_after);
            clock_t utime = ts_after.tms_utime -
                ts_before.tms_utime;
            double timeSpentInS=static_cast<double>(utime) / sysconf(_SC_CLK_TCK);
//            cout << timeSpentInS << endl;
            if(timeSpentInS>_m_deadline)
            {
                std::stringstream ss;
                ss << "GeneralizedMAAStarPlanner::Plan() we spent "
                   << timeSpentInS << "s, which is more than the deadline of "
                   << _m_deadline << "s, bailing out...";
                EDeadline e(ss.str());
                throw(e);
            }
        }

        StartTimer("GMAA::Plan::iteration");
        if(_m_saveIntermediateTiming)
            SaveTimers(_m_intermediateTimingFilename);

        if(_m_verboseness >= 2) {
            cout << "\n---------------------------------------------------\n";
            cout << "-->>Start of new GMAA iteration, polpool size="<<
                pp_p->Size()<<"<<--"<<endl;
        }

        PartialPolicyPoolItemInterface_sharedPtr ppi = pp_p->Select();
        boost::shared_ptr<PartialJointPolicyDiscretePure> jpol_sel =  ppi->GetJPol();
        double v_sel = ppi->GetValue();
        size_t depth_sel = jpol_sel->GetDepth();
        if(_m_verboseness >= 3) {
            cout << "GMAA Selected a partial jpol of depth="<< depth_sel << " and heur. val="<<v_sel<<
                " to expand" << endl;
            if(_m_verboseness >= 4) 
                ppi->GetJPol()->Print();
        }
        //cout << "SELECTed partial pol with heur. val="<<v_sel<<endl;
        
        if( (v_sel + _m_slack) < _m_maxLowerBound) //the highest upperbound < the best lower
        {
            //  1)if JPolValPool is no priority queue, this should be changed.
            if(_m_verboseness >= 0)
                cout<<"!!!GMAA::Plan highest upper < best found lower bound, stopping\n";
            break;
        }

        //poolOfNextPolicies     = {<pol,vals>} 
        //isLowerBound  = bool   - whether the vals are lower bounds to the 
        //                optimal value (i.e. value for the optimal policy)
        //<poolOfNextPolicies,isLowerBound>=ConstructAndValuateNextPolicies(ppi)

        PartialPolicyPoolInterface_sharedPtr poolOfNextPolicies = NewPP();
        bool cleanUpPPI=true;
        bool are_LBs =
            ConstructAndValuateNextPolicies(ppi,
                                            poolOfNextPolicies,
                                            cleanUpPPI);

        //this keeps track of the actually expanded *nodes*
        //however, due to our clever stuff we never exand all the nodes anymore
        //so we will need to extract the information of 'non-incremental expansion'
        //from within the CBG solver...
        if(_m_expanded_childs.size()<=depth_sel)
            _m_expanded_childs.resize(depth_sel+1,0);
        _m_expanded_childs.at(depth_sel) += poolOfNextPolicies->Size();

        //Clean up ppi - that is we remove the top element of the policy pool because that was just expanded (right?)
        if(cleanUpPPI)
            pp_p->Pop(ppi);
        else
        {
            pp_p->Pop(ppi);
            pp_p->Insert(ppi);
            
        }

#if DEBUG_GMAA4        
        if(DEBUG_GMAA4){
            cout << "--------------------------------------------------\n"<<
                    ">>>The next policies found, poolOfNextPolicies:"<<endl;
            PartialPolicyPoolInterface_sharedPtr pp_copy = NewPP();
            *pp_copy = *poolOfNextPolicies;
            while(! pp_copy->Empty())
            {
                PartialPolicyPoolItemInterface_sharedPtr it = pp_copy->Select();
                it->Print();
                cout << endl;
                pp_copy->Pop();
            }
            cout << "<<<\n---------------------------------------------"<<endl;
        }
#endif        

        //if(isLowerBound)
        //    Prune( JPolValPool, max(lowerBound) )
        if(are_LBs && poolOfNextPolicies->Size() > 0)
        {
            PartialPolicyPoolItemInterface_sharedPtr bestRanked_ppi = poolOfNextPolicies->
                GetBestRanked();
            poolOfNextPolicies->PopBestRanked();
            double bestNextVal = bestRanked_ppi->GetValue();
            if(bestNextVal > _m_maxLowerBound) //new best lowerbound (and policy) found
            {
                _m_maxLowerBound = bestNextVal;
                *bestJPol = *(bestRanked_ppi->GetJPol());
                if(_m_verboseness >= 2) {
                    cout << "new bestJPol (and max. lowerbound) found! - ";
                    cout << "value v="
                         << bestNextVal <<" - "
                         << bestRanked_ppi->GetJPol()->SoftPrintBrief() << endl;
                }
                if(_m_verboseness >= 4) 
                    cout << "new bestJPol->SoftPrint():"<<bestJPol->SoftPrint();

                //if we maintain the internal timings...
                if(_m_intermediateResultFile != 0)
                {
                    tms ts_cur;
                    clock_t tck_cur;
                    tck_cur = times(&ts_cur);
                    clock_t diff = tck_cur - tck_start;
                    its << diff << "\t" <<  _m_maxLowerBound << endl;
                }
                // prune JPolValPool
                pp_p->Prune(_m_maxLowerBound - _m_slack );
            }
        }
        SelectPoliciesToProcessFurther(poolOfNextPolicies, are_LBs, _m_maxLowerBound - _m_slack);
        pp_p->Union(poolOfNextPolicies);

        if( _m_maxJPolPoolSize < pp_p->Size())
            _m_maxJPolPoolSize = pp_p->Size();
        
        StopTimer("GMAA::Plan::iteration");
        if(_m_verboseness >= 2) { 
            if(_m_maxLowerBound==-DBL_MAX)
                cout << "--GMAA::Plan::iteration ending, polpool size="<<pp_p->Size()<<", no complete policy found yet";
            else
            {
                cout << "--GMAA::Plan::iteration ending, polpool size="<<pp_p->Size()<<", best policy found so far:";
                cout << endl << bestJPol->SoftPrintBrief()  <<endl;
                if(_m_verboseness >= 5)  
                    cout << endl << bestJPol->SoftPrint()  <<endl;
            }
        }
    } 
    while(! pp_p->Empty() ); //<- end do...while

    //we don't want to do any conversions here... takes (sometimes too much)
    //time...
    _m_foundPolicy=bestJPol;  //->ToJointPolicyPureVector());

    _m_expectedRewardFoundPolicy=_m_maxLowerBound;
    if(_m_verboseness >= 1) {
        cout << "\n----GMAA::Plan ending, best policy found:----\n";
        cout << bestJPol->SoftPrintBrief() << " = " <<endl;
        if(_m_verboseness >= 3) 
            cout << _m_foundPolicy->SoftPrint() << endl;
        cout << endl;
        if(_m_verboseness >= 2)
        {
            JPPV_sharedPtr jppv = _m_foundPolicy->ToJointPolicyPureVector();
            jppv->Print();
        }
    }
    if(_m_verboseness >= 2)    
        cout << "\n\n ";
    if(_m_verboseness >= 0)    
        cout << "GMAA::Plan GMAA ENDED"<<endl;
    if(_m_verboseness >= 2)    
        cout << "\n\n ";

    StopTimer("GMAA::Plan");

    if(_m_verboseness >= 0)    
    {
        cout << "Expanded nodes at different stages:\n"<<
            PrintTools::SoftPrintVector(_m_expanded_childs)<<endl;
        cout << "Maximum number of nodes that could have been expanded:\n"<<
            PrintTools::SoftPrintVector(_m_max_expanded_childs)<<endl;
    }
}